

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

InstanceSymbol *
slang::ast::InstanceSymbol::createDefault
          (Compilation *compilation,Definition *definition,ParamOverrideNode *paramOverrideNode)

{
  InstanceBodySymbol *args_2;
  InstanceSymbol *pIVar1;
  
  args_2 = InstanceBodySymbol::fromDefinition(compilation,definition,false,paramOverrideNode);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::InstanceBodySymbol&>
                     (&compilation->super_BumpAllocator,&definition->name,&definition->location,
                      args_2);
  return pIVar1;
}

Assistant:

InstanceSymbol& InstanceSymbol::createDefault(Compilation& compilation,
                                              const Definition& definition,
                                              const ParamOverrideNode* paramOverrideNode) {
    return *compilation.emplace<InstanceSymbol>(
        definition.name, definition.location,
        InstanceBodySymbol::fromDefinition(compilation, definition,
                                           /* isUninstantiated */ false, paramOverrideNode));
}